

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CGL::OSDText::OSDText(OSDText *this)

{
  pointer pOVar1;
  vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_> *in_RDI;
  vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_> *__x;
  undefined1 local_30 [48];
  
  __x = in_RDI + 2;
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::vector
            ((vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_> *)0x2511e1);
  *(undefined1 *)
   &(in_RDI->super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>)._M_impl.
    super__Vector_impl_data._M_start = 0;
  pOVar1 = (pointer)operator_new(8);
  in_RDI[1].super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar1;
  pOVar1 = (pointer)operator_new(8);
  in_RDI[1].super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pOVar1;
  memset(local_30,0,0x18);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::vector
            ((vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_> *)0x251242);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::operator=(in_RDI,__x);
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::~vector(in_RDI);
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>)._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  return;
}

Assistant:

OSDText::OSDText() {

  use_hdpi = false;

  ft   = new FT_Library;
  face = new FT_Face;

  lines = vector<OSDLine>(); next_id = 0;
}